

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O3

bool anon_unknown.dwarf_8e5514::EqualDescriptor(string *a,string *b)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  size_t __n;
  int iVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = a->_M_string_length;
  if (uVar3 < 10) {
    uVar5 = b->_M_string_length;
    if (uVar5 < 10) goto LAB_003baf90;
    cVar2 = (b->_M_dataplus)._M_p[uVar5 - 9];
joined_r0x003baf4c:
    if (cVar2 != '#') goto LAB_003baf90;
  }
  else {
    cVar1 = (a->_M_dataplus)._M_p[uVar3 - 9];
    uVar5 = b->_M_string_length;
    if (uVar5 < 10) {
      if (cVar1 != '#') goto LAB_003baf90;
      bVar6 = false;
    }
    else {
      cVar2 = (b->_M_dataplus)._M_p[uVar5 - 9];
      bVar6 = cVar2 == '#';
      if ((cVar1 == '#') == bVar6) goto LAB_003baf90;
      if (cVar1 != '#') goto joined_r0x003baf4c;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,a,0,uVar3 - 9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (a,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) goto LAB_003baf90;
    uVar5 = b->_M_string_length;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,b,0,uVar5 - 9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (b,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_003baf90:
  __n = a->_M_string_length;
  if (__n == b->_M_string_length) {
    if (__n == 0) {
      bVar6 = true;
    }
    else {
      iVar4 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
      bVar6 = iVar4 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool EqualDescriptor(std::string a, std::string b)
{
    bool a_check = (a.size() > 9 && a[a.size() - 9] == '#');
    bool b_check = (b.size() > 9 && b[b.size() - 9] == '#');
    if (a_check != b_check) {
        if (a_check) a = a.substr(0, a.size() - 9);
        if (b_check) b = b.substr(0, b.size() - 9);
    }
    return a == b;
}